

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O2

void Abc_NodeSupportClear_rec(DdNode *bFunc)

{
  for (; (((ulong)bFunc->next & 1) != 0 &&
         (bFunc->next = (DdNode *)((ulong)bFunc->next & 0xfffffffffffffffe),
         bFunc->index != 0x7fffffff));
      bFunc = (DdNode *)((ulong)(bFunc->type).kids.E & 0xfffffffffffffffe)) {
    Abc_NodeSupportClear_rec((bFunc->type).kids.T);
  }
  return;
}

Assistant:

void Abc_NodeSupportClear_rec( DdNode * bFunc )
{
    if ( !Cudd_IsComplement(bFunc->next) )
        return;
    bFunc->next = Cudd_Regular(bFunc->next);
    if ( cuddIsConstant(bFunc) )
        return;
    Abc_NodeSupportClear_rec( cuddT(bFunc) );
    Abc_NodeSupportClear_rec( Cudd_Regular(cuddE(bFunc)) );
}